

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

State csv::parse(IDataSource *parser,FieldCallback *emitField,RecordCallback *emitRecord)

{
  bool bVar1;
  int iVar2;
  _func_int **pp_Var3;
  uint uVar4;
  State SVar5;
  size_t sVar6;
  byte bVar7;
  size_t sVar8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  record record;
  field field;
  function<bool_(const_csv::field_&)> local_70;
  string local_50 [32];
  
  parser->cancelled = false;
  iVar2 = (*parser->_vptr_IDataSource[2])();
  SVar5 = Complete;
  if ((char)iVar2 != '\0') {
    record.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    record.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    record.row = 0;
    record.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    sVar8 = 0;
    do {
      std::vector<csv::field,_std::allocator<csv::field>_>::clear(&record.content);
      record.row = sVar8;
      std::function<bool_(const_csv::field_&)>::function(&local_70,emitField);
      field.row = 0;
      field.column = 0;
      field.content._M_dataplus._M_p = (pointer)&field.content.field_2;
      field.content._M_string_length = 0;
      field.content.field_2._M_local_buf[0] = '\0';
      bVar1 = true;
      sVar6 = 0;
LAB_00114b55:
      if (parser->cancelled == false) {
        (*parser->_vptr_IDataSource[9])(parser);
        if ((bVar1) && (iVar2 = (*parser->_vptr_IDataSource[4])(parser), (char)iVar2 != '\0')) {
          do {
            iVar2 = (*parser->_vptr_IDataSource[8])(parser);
            if ((char)iVar2 != '\0') goto LAB_00114bcf;
            iVar2 = (*parser->_vptr_IDataSource[2])(parser);
          } while ((char)iVar2 != '\0');
          goto LAB_00114cca;
        }
        if (parser->trimLeadingWhitespace == true) {
          do {
            iVar2 = (*parser->_vptr_IDataSource[6])(parser);
            if ((char)iVar2 == '\0') break;
            iVar2 = (*parser->_vptr_IDataSource[2])(parser);
          } while ((char)iVar2 != '\0');
        }
        iVar2 = (*parser->_vptr_IDataSource[8])(parser);
        if ((char)iVar2 == '\0') {
          iVar2 = (*parser->_vptr_IDataSource[7])(parser);
          if ((char)iVar2 == '\0') {
            do {
              if (parser->cancelled != false) goto LAB_00114d9a;
              iVar2 = (*parser->_vptr_IDataSource[5])(parser);
              if ((char)iVar2 != '\0') goto LAB_00114da4;
              iVar2 = (*parser->_vptr_IDataSource[8])(parser);
              if ((char)iVar2 != '\0') goto LAB_00114bcf;
              iVar2 = (*parser->_vptr_IDataSource[7])(parser);
              pp_Var3 = parser->_vptr_IDataSource;
              if ((char)iVar2 != '\0') {
                iVar2 = (*pp_Var3[2])(parser);
                if ((char)iVar2 == '\0') break;
                iVar2 = (*parser->_vptr_IDataSource[7])(parser);
                pp_Var3 = parser->_vptr_IDataSource;
                if ((char)iVar2 == '\0') {
                  (*pp_Var3[3])(parser);
                  pp_Var3 = parser->_vptr_IDataSource;
                }
              }
              (*pp_Var3[10])(parser);
              iVar2 = (*parser->_vptr_IDataSource[2])(parser);
            } while ((char)iVar2 != '\0');
          }
          else {
            iVar2 = (*parser->_vptr_IDataSource[2])(parser);
            while ((char)iVar2 != '\0') {
              if (parser->cancelled != false) goto LAB_00114d9a;
              iVar2 = (*parser->_vptr_IDataSource[7])(parser);
              pp_Var3 = parser->_vptr_IDataSource;
              if ((char)iVar2 != '\0') {
                iVar2 = (*pp_Var3[2])(parser);
                if ((char)iVar2 == '\0') break;
                iVar2 = (*parser->_vptr_IDataSource[7])(parser);
                if ((char)iVar2 == '\0') goto LAB_00114d64;
                pp_Var3 = parser->_vptr_IDataSource;
              }
              (*pp_Var3[10])(parser);
              iVar2 = (*parser->_vptr_IDataSource[2])(parser);
            }
          }
          goto LAB_00114cca;
        }
LAB_00114bcf:
        uVar4 = 1;
        goto LAB_00114ccc;
      }
LAB_00114dae:
      uVar4 = 3;
LAB_00114df0:
      std::__cxx11::string::~string((string *)&field.content);
      std::_Function_base::~_Function_base(&local_70.super__Function_base);
      if (((parser->skipBlankLines != true) || (bVar1 = csv::record::empty(&record), !bVar1)) &&
         (sVar8 = sVar8 + 1, (emitRecord->super__Function_base)._M_manager != (_Manager_type)0x0)) {
        (*parser->_vptr_IDataSource[0xc])(parser);
        bVar1 = std::function<bool_(const_csv::record_&,_double)>::operator()
                          (emitRecord,&record,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        if (bVar1) goto LAB_00114e4f;
LAB_00114e71:
        SVar5 = Complete;
        goto LAB_00114e73;
      }
LAB_00114e4f:
      iVar2 = (*parser->_vptr_IDataSource[2])(parser);
      if ((char)iVar2 == '\0') goto LAB_00114e71;
    } while (uVar4 < 2);
    SVar5 = (State)(uVar4 == 3);
LAB_00114e73:
    std::vector<csv::field,_std::allocator<csv::field>_>::~vector(&record.content);
  }
  return SVar5;
LAB_00114d9a:
  uVar4 = 3;
  goto LAB_00114ccc;
  while( true ) {
    iVar2 = (*parser->_vptr_IDataSource[5])(parser);
    if ((char)iVar2 != '\0') goto LAB_00114da4;
    iVar2 = (*parser->_vptr_IDataSource[2])(parser);
    if ((char)iVar2 == '\0') break;
LAB_00114d64:
    iVar2 = (*parser->_vptr_IDataSource[8])(parser);
    if ((char)iVar2 != '\0') goto LAB_00114bcf;
  }
LAB_00114cca:
  uVar4 = 2;
LAB_00114ccc:
  bVar7 = 0;
LAB_00114ccd:
  if (parser->cancelled != false) goto LAB_00114dae;
  (*parser->_vptr_IDataSource[0xb])(local_50,parser);
  std::__cxx11::string::operator=((string *)&field.content,local_50);
  std::__cxx11::string::~string(local_50);
  field.row = record.row;
  field.column = sVar6;
  std::vector<csv::field,_std::allocator<csv::field>_>::push_back(&record.content,&field);
  if (local_70.super__Function_base._M_manager == (_Manager_type)0x0) {
    if (bVar7 == 0) goto LAB_00114df0;
  }
  else {
    bVar1 = std::function<bool_(const_csv::field_&)>::operator()(&local_70,&field);
    if ((bVar7 & bVar1) == 0) {
      if (!bVar1) {
        uVar4 = 2;
      }
      goto LAB_00114df0;
    }
  }
  iVar2 = (*parser->_vptr_IDataSource[5])(parser);
  if (((char)iVar2 == '\0') ||
     (iVar2 = (*parser->_vptr_IDataSource[2])(parser), (char)iVar2 == '\0')) {
    std::__cxx11::string::assign((char *)&field.content);
    field.column = sVar6 + 1;
    field.row = record.row;
    std::vector<csv::field,_std::allocator<csv::field>_>::push_back(&record.content,&field);
    uVar4 = 2;
    goto LAB_00114df0;
  }
  sVar6 = sVar6 + 1;
  bVar1 = false;
  goto LAB_00114b55;
LAB_00114da4:
  uVar4 = 0;
  bVar7 = 1;
  goto LAB_00114ccd;
}

Assistant:

State parse(IDataSource& parser, FieldCallback emitField, RecordCallback emitRecord) {
		//  file = [header CRLF] record *(CRLF record) [CRLF]

		InternalState state = InternalState::EndOfFile;
		parser.cancelled = false;

		// Move to the first character
		if (!parser.next()) {
			// File is empty.  Do nothing
			return State::Complete;
		}

		csv::record record;

		size_t row = 0;
		do {
			record.content.clear();
			record.row = row;

			state = parseRecord(parser, record, emitField);

			if (!parser.skipBlankLines || !record.empty()) {
				row++;
				if (emitRecord && (emitRecord(record, parser.progress()) == false)) {
					return State::Complete;
				}
			}

			if (!parser.next()) {
				return State::Complete;
			}
		}
		while (state != InternalState::Canceled && state != InternalState::EndOfFile);

		switch (state) {
			case InternalState::Canceled:
				return State::Cancelled;
			case InternalState::EndOfFile:
				return State::Complete;
			default:
				assert(false);
				return State::Error;
		}
	}